

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  bool bVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  int iVar9;
  int iVar10;
  sqlite3_io_methods *psVar11;
  sqlite3_file sVar12;
  sqlite3_io_methods *psVar13;
  int iVar14;
  long lVar15;
  FileChunk *pIter;
  sqlite3_io_methods *psVar16;
  int iVar17;
  size_t __n;
  
  iVar10 = *(int *)((long)&pJfd[1].pMethods + 4);
  if (((long)iVar10 < 1) || (iAmt + iOfst <= (long)iVar10)) {
    if (iOfst < 1) {
      if ((iOfst == 0) && (pJfd[2].pMethods != (sqlite3_io_methods *)0x0)) {
        memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
        return 0;
      }
    }
    else if (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst) {
      memjrnlTruncate(pJfd,iOfst);
    }
    if (iAmt < 1) {
      return 0;
    }
    psVar11 = pJfd[3].pMethods;
    do {
      psVar13 = pJfd[4].pMethods;
      iVar10 = *(int *)&pJfd[1].pMethods;
      lVar15 = (long)psVar11 % (long)iVar10;
      iVar14 = iVar10 - (int)lVar15;
      if (iAmt < iVar14) {
        iVar14 = iAmt;
      }
      sVar12.pMethods = psVar13;
      if (lVar15 == 0) {
        sVar12.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar10 + 8);
        if (sVar12.pMethods == (sqlite3_io_methods *)0x0) {
          return 0xc0a;
        }
        if (psVar13 == (sqlite3_io_methods *)0x0) {
          psVar13 = (sqlite3_io_methods *)(pJfd + 2);
        }
        *(undefined8 *)sVar12.pMethods = 0;
        *(sqlite3_io_methods **)psVar13 = sVar12.pMethods;
        pJfd[4].pMethods = sVar12.pMethods;
      }
      __n = (size_t)iVar14;
      memcpy((void *)((long)&(sVar12.pMethods)->xClose + lVar15),zBuf,__n);
      zBuf = (void *)((long)zBuf + __n);
      psVar11 = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
      pJfd[3].pMethods = psVar11;
      iVar10 = iAmt - iVar14;
      bVar6 = iVar14 <= iAmt;
      iAmt = iVar10;
    } while (iVar10 != 0 && bVar6);
    return 0;
  }
  psVar11 = pJfd->pMethods;
  iVar14 = *(int *)&pJfd[1].pMethods;
  psVar13 = pJfd[2].pMethods;
  psVar1 = pJfd[3].pMethods;
  psVar2 = pJfd[6].pMethods;
  psVar7 = pJfd[4].pMethods;
  psVar8 = pJfd[5].pMethods;
  psVar3 = pJfd[7].pMethods;
  psVar4 = pJfd[8].pMethods;
  psVar5 = pJfd[9].pMethods;
  pJfd->pMethods = (sqlite3_io_methods *)0x0;
  pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
  iVar9 = (*psVar4->xSync)((sqlite3_file *)psVar4,(int)psVar5);
  if (iVar9 == 0) {
    if (psVar13 != (sqlite3_io_methods *)0x0) {
      lVar15 = 0;
      psVar16 = psVar13;
      iVar17 = iVar14;
      do {
        if ((long)psVar1 < lVar15 + iVar17) {
          iVar17 = (int)psVar1 - (int)lVar15;
        }
        iVar9 = (*pJfd->pMethods->xWrite)(pJfd,&psVar16->xClose,iVar17,lVar15);
        if (iVar9 != 0) goto LAB_00149f11;
        lVar15 = lVar15 + iVar17;
        psVar16 = *(sqlite3_io_methods **)psVar16;
      } while (psVar16 != (sqlite3_io_methods *)0x0);
      do {
        psVar11 = *(sqlite3_io_methods **)psVar13;
        sqlite3_free(psVar13);
        psVar13 = psVar11;
      } while (psVar11 != (sqlite3_io_methods *)0x0);
    }
    iVar10 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
    return iVar10;
  }
LAB_00149f11:
  if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
    (*pJfd->pMethods->xClose)(pJfd);
  }
  pJfd->pMethods = psVar11;
  *(int *)&pJfd[1].pMethods = iVar14;
  *(int *)((long)&pJfd[1].pMethods + 4) = iVar10;
  pJfd[2].pMethods = psVar13;
  pJfd[3].pMethods = psVar1;
  pJfd[6].pMethods = psVar2;
  pJfd[4].pMethods = psVar7;
  pJfd[5].pMethods = psVar8;
  pJfd[7].pMethods = psVar3;
  pJfd[8].pMethods = psVar4;
  pJfd[9].pMethods = psVar5;
  return iVar9;
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}